

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O3

void __thiscall
CoreML::NeuralNetworkShaper::shapeReshapeLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  RepeatedField<long> *this_00;
  LogMessage *pLVar1;
  mapped_type *this_01;
  mapped_type *this_02;
  ShapeRange *pSVar2;
  ShapeRange *other;
  size_t *psVar3;
  long *plVar4;
  undefined1 *from;
  ReshapeLayerParams reshape;
  LogFinisher local_a9;
  LogMessage local_a8;
  ReshapeLayerParams local_70;
  ShapeRange local_40;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_a8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_a8);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_a8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_a8);
  }
  this_02 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_a8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_a8);
  }
  ShapeConstraint::setName
            (this_02,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if (specLayer->_oneof_case_[0] == 300) {
    from = *(undefined1 **)&specLayer->layer_;
  }
  else {
    from = Specification::_ReshapeLayerParams_default_instance_;
  }
  Specification::ReshapeLayerParams::ReshapeLayerParams(&local_70,(ReshapeLayerParams *)from);
  pSVar2 = ShapeConstraint::batchRange(this_01);
  ShapeConstraint::updateBatchRange(this_02,pSVar2);
  this_00 = &local_70.targetshape_;
  if (local_70.targetshape_.current_size_ == 3) {
    pSVar2 = ShapeConstraint::sequenceRange(this_02);
    other = ShapeConstraint::sequenceRange(this_01);
    ShapeRange::intersect((ShapeRange *)&local_a8,pSVar2,other);
    ShapeConstraint::updateSequenceRange(this_02,(ShapeRange *)&local_a8);
    if (local_70.targetshape_.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x280);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_a8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a8);
    }
    psVar3 = (size_t *)google::protobuf::RepeatedField<long>::elements(this_00);
    ShapeConstraint::setChannel(this_02,*psVar3);
    if (local_70.targetshape_.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x280);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_a8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a8);
    }
    plVar4 = google::protobuf::RepeatedField<long>::elements(this_00);
    ShapeConstraint::setHeight(this_02,plVar4[1]);
    if (local_70.targetshape_.current_size_ < 3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x280);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_a8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a8);
    }
    plVar4 = google::protobuf::RepeatedField<long>::elements(this_00);
    psVar3 = (size_t *)(plVar4 + 2);
  }
  else {
    if (local_70.targetshape_.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x280);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_a8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_a9,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a8);
    }
    psVar3 = (size_t *)google::protobuf::RepeatedField<long>::elements(this_00);
    ShapeRange::ShapeRange(&local_40,*psVar3);
    ShapeConstraint::updateSequenceRange(this_02,&local_40);
    if (local_70.targetshape_.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x280);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_a8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a8);
    }
    plVar4 = google::protobuf::RepeatedField<long>::elements(this_00);
    ShapeConstraint::setChannel(this_02,plVar4[1]);
    if (local_70.targetshape_.current_size_ < 3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x280);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_a8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a8);
    }
    plVar4 = google::protobuf::RepeatedField<long>::elements(this_00);
    ShapeConstraint::setHeight(this_02,plVar4[2]);
    if (local_70.targetshape_.current_size_ < 4) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x280);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_a8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a8);
    }
    plVar4 = google::protobuf::RepeatedField<long>::elements(this_00);
    psVar3 = (size_t *)(plVar4 + 3);
  }
  ShapeConstraint::setWidth(this_02,*psVar3);
  Specification::ReshapeLayerParams::~ReshapeLayerParams(&local_70);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeReshapeLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Reshape layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Reshape layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    // TODO: there is some cross shape constraint here -- all 3 or 4 input ranges might be unconstrained, but now they are constrained to a combination whose product is
    // equal to the product of the output shapes

    Specification::ReshapeLayerParams reshape = specLayer.reshape();

    outputShape.updateBatchRange(inputShape.batchRange());

    if (reshape.targetshape_size() == 3) {
        outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
        outputShape.setChannel(static_cast<size_t>(reshape.targetshape(0)));
        outputShape.setHeight(static_cast<size_t>(reshape.targetshape(1)));
        outputShape.setWidth(static_cast<size_t>(reshape.targetshape(2)));
    } else {
        outputShape.updateSequenceRange(static_cast<size_t>(reshape.targetshape(0)));
        outputShape.setChannel(static_cast<size_t>(reshape.targetshape(1)));
        outputShape.setHeight(static_cast<size_t>(reshape.targetshape(2)));
        outputShape.setWidth(static_cast<size_t>(reshape.targetshape(3)));
    }

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Reshape layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Reshape layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}